

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dice.cpp
# Opt level: O0

void __thiscall DiceRoller::DiceRoller(DiceRoller *this,DiceRoller *toCopy)

{
  int *piVar1;
  vector<int,_std::allocator<int>_> *this_00;
  DiceRoller *toCopy_local;
  DiceRoller *this_local;
  
  piVar1 = (int *)operator_new(4);
  *piVar1 = 0;
  this->diceRolled = piVar1;
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  this->history = this_00;
  *this->diceRolled = *toCopy->diceRolled;
  std::vector<int,_std::allocator<int>_>::operator=(this->history,toCopy->history);
  return;
}

Assistant:

DiceRoller::DiceRoller(const DiceRoller &toCopy) {
    diceRolled = new int();
    history = new vector<int>;
    *diceRolled = *toCopy.diceRolled;
    *history = *toCopy.history;
}